

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_struct<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  detail *pdVar7;
  ulong uVar8;
  detail *unaff_RBP;
  detail *pdVar9;
  int iVar10;
  long lVar11;
  detail *pdVar12;
  detail *in_R11;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  string_view tag_00;
  string_view tags;
  detail *extraout_RDX;
  
  sVar6 = tag._len;
  pdVar7 = (detail *)tag._ptr;
  uVar4 = full_tag._len;
  pdVar9 = (detail *)full_tag._ptr;
  uVar13 = sVar6 - 1;
  if (sVar6 == 0) {
    uVar13 = 0;
  }
  uVar3 = 0;
  if (sVar6 != 0 && sVar6 - 1 != 0) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (pdVar7[uVar2] == (detail)0x60) break;
      uVar2 = uVar2 + 1;
      uVar3 = uVar13;
    } while (uVar13 != uVar2);
  }
  uVar2 = uVar3;
  if (uVar13 < uVar3) {
    uVar2 = uVar13;
  }
  uVar13 = uVar13 - uVar2;
  if (uVar13 == 0) {
    if (uVar3 != 0) {
      do {
        if (uVar4 == 0) goto LAB_0015e5e5;
        uVar2 = uVar4;
        pdVar12 = pdVar9;
        do {
          uVar8 = 0;
          do {
            if (uVar2 == uVar8) {
              bVar1 = false;
              in_R11 = pdVar9 + uVar4;
              goto LAB_0015e53e;
            }
            if (pdVar12[uVar8] != pdVar7[uVar8]) {
              bVar1 = true;
              goto LAB_0015e53e;
            }
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
          bVar1 = false;
          in_R11 = pdVar12;
LAB_0015e53e:
          pdVar12 = pdVar12 + 1;
          uVar2 = uVar2 - 1;
        } while (bVar1);
        uVar2 = (long)in_R11 - (long)pdVar9;
        if (in_R11 == pdVar9 + uVar4) {
          uVar2 = 0xffffffffffffffff;
        }
        if (uVar4 < uVar2) {
          uVar2 = uVar4;
        }
        uVar4 = uVar4 - uVar2;
        uVar8 = uVar3;
        if (uVar4 < uVar3) {
          uVar8 = uVar4;
        }
        pdVar9 = pdVar9 + uVar8 + uVar2;
        iVar10 = 3;
        uVar4 = uVar4 - uVar8;
        if ((uVar4 != 0) && (*pdVar9 != (detail)0x7d)) {
          if (*pdVar9 == (detail)0x60) {
            iVar10 = 1;
            unaff_RBP = pdVar9;
            if (uVar4 == 1) {
              uVar13 = 0;
            }
            else {
              uVar13 = 1;
              lVar11 = 1;
              do {
                if (pdVar9[uVar13] == (detail)0x7d) {
                  lVar11 = lVar11 + -1;
                  if (lVar11 == 0) goto LAB_0015e5d6;
                }
                else if (pdVar9[uVar13] == (detail)0x7b) {
                  lVar11 = lVar11 + 1;
                }
                uVar13 = uVar13 + 1;
              } while (uVar4 != uVar13);
              uVar13 = uVar4 - 1;
            }
          }
          else {
            iVar10 = 0;
          }
        }
LAB_0015e5d6:
      } while (iVar10 == 0);
      if (iVar10 == 1) goto joined_r0x0015e5ed;
    }
LAB_0015e5e5:
    unaff_RBP = (detail *)0x0;
    uVar13 = 0;
  }
  else {
    pdVar7 = pdVar7 + uVar2;
    unaff_RBP = pdVar7;
  }
joined_r0x0015e5ed:
  do {
    if (uVar13 == 0) {
      return;
    }
    uVar13 = uVar13 - 1;
    if (uVar13 == 0) {
      uVar4 = 1;
    }
    else {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (unaff_RBP[uVar3 + 1] == (detail)0x27) break;
        uVar3 = uVar3 + 1;
        uVar4 = uVar13;
      } while (uVar13 != uVar3);
      uVar4 = uVar4 + 1;
    }
    if (uVar13 < uVar4) {
      uVar4 = uVar13;
    }
    pdVar9 = unaff_RBP + uVar4 + 1;
    pcVar14 = (char *)(uVar13 - uVar4);
    tags._len = (size_t)pdVar7;
    tags._ptr = pcVar14;
    pcVar5 = (char *)tag_first_size(pdVar9,tags);
    pcVar15 = pcVar5;
    if (pcVar14 < pcVar5) {
      pcVar15 = pcVar14;
    }
    tag_00._len = (size_t)pcVar5;
    tag_00._ptr = (char *)pdVar9;
    visit_impl<Visitor,std::ifstream>(full_tag,tag_00,visitor,istream,max_recursion);
    uVar13 = (long)pcVar14 - (long)pcVar15;
    pdVar7 = extraout_RDX;
    unaff_RBP = pdVar9 + (long)pcVar15;
  } while( true );
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}